

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O2

double __thiscall tinyxml2::XMLElement::DoubleAttribute(XMLElement *this,char *name)

{
  double d;
  double local_10;
  
  local_10 = 0.0;
  QueryDoubleAttribute(this,name,&local_10);
  return local_10;
}

Assistant:

double 	 DoubleAttribute( const char* name ) const	{
        double d=0;
        QueryDoubleAttribute( name, &d );
        return d;
    }